

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_sequencetask.cc
# Opt level: O0

void SequenceTask::run(search *sch,multi_ex *ec)

{
  ulong uVar1;
  byte bVar2;
  action aVar3;
  size_type sVar4;
  reference ppeVar5;
  vector<example_*,_std::allocator<example_*>_> *in_RSI;
  search *in_RDI;
  action in_stack_00000034;
  search *in_stack_00000038;
  size_t prediction;
  action oracle;
  size_t i;
  predictor P;
  undefined4 in_stack_fffffffffffffe58;
  action in_stack_fffffffffffffe5c;
  predictor *in_stack_fffffffffffffe60;
  size_t *in_stack_fffffffffffffe68;
  predictor *in_stack_fffffffffffffe70;
  string local_140 [48];
  ulong local_110;
  float local_104;
  int local_100;
  search *in_stack_ffffffffffffff08;
  example *in_stack_ffffffffffffff10;
  predictor *in_stack_ffffffffffffff38;
  
  uVar1 = _local_100 >> 0x20;
  Search::predictor::predictor
            ((predictor *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,(ptag)uVar1);
  for (_local_100 = 0; uVar1 = _local_100,
      sVar4 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RSI), uVar1 < sVar4;
      _local_100 = _local_100 + 1) {
    ppeVar5 = std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RSI,_local_100);
    local_104 = ((*ppeVar5)->l).simple.label;
    Search::predictor::set_tag((predictor *)&stack0xffffffffffffff08,local_100 + 1);
    std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RSI,_local_100);
    Search::predictor::set_input
              (in_stack_fffffffffffffe60,
               (example *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    Search::predictor::set_oracle(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
    Search::search::get_history_length(in_RDI);
    Search::predictor::set_condition_range
              (in_stack_fffffffffffffe70,(ptag)((ulong)in_stack_fffffffffffffe68 >> 0x20),
               (ptag)in_stack_fffffffffffffe68,(char)((ulong)in_stack_fffffffffffffe60 >> 0x38));
    aVar3 = Search::predictor::predict(in_stack_ffffffffffffff38);
    local_110 = (ulong)aVar3;
    Search::search::output_abi_cxx11_(in_RDI);
    bVar2 = std::ios::good();
    if ((bVar2 & 1) != 0) {
      in_stack_fffffffffffffe70 = (predictor *)Search::search::output_abi_cxx11_(in_RDI);
      in_stack_fffffffffffffe68 = &in_stack_fffffffffffffe70->ec_cnt;
      Search::search::pretty_label_abi_cxx11_(in_stack_00000038,in_stack_00000034);
      in_stack_fffffffffffffe60 =
           (predictor *)std::operator<<((ostream *)in_stack_fffffffffffffe68,local_140);
      std::operator<<((ostream *)in_stack_fffffffffffffe60,' ');
      std::__cxx11::string::~string(local_140);
    }
  }
  Search::predictor::~predictor(in_stack_fffffffffffffe60);
  return;
}

Assistant:

void run(Search::search& sch, multi_ex& ec)
{
  Search::predictor P(sch, (ptag)0);
  for (size_t i = 0; i < ec.size(); i++)
  {
    action oracle = ec[i]->l.multi.label;
    size_t prediction = P.set_tag((ptag)i + 1)
                            .set_input(*ec[i])
                            .set_oracle(oracle)
                            .set_condition_range((ptag)i, sch.get_history_length(), 'p')
                            .predict();

    if (sch.output().good())
      sch.output() << sch.pretty_label((uint32_t)prediction) << ' ';
  }
}